

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

void Cec_ManSimCompareConstScore(uint *p,int nWords,int *pScores)

{
  int iVar1;
  int local_28;
  int local_24;
  int b;
  int w;
  int *pScores_local;
  int nWords_local;
  uint *p_local;
  
  if ((*p & 1) == 0) {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      if (p[local_24] != 0) {
        for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
          if ((p[local_24] >> ((byte)local_28 & 0x1f) & 1) != 0) {
            iVar1 = local_24 * 0x20 + local_28;
            pScores[iVar1] = pScores[iVar1] + 1;
          }
        }
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      if (p[local_24] != 0xffffffff) {
        for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
          if (((p[local_24] ^ 0xffffffff) >> ((byte)local_28 & 0x1f) & 1) != 0) {
            iVar1 = local_24 * 0x20 + local_28;
            pScores[iVar1] = pScores[iVar1] + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Cec_ManSimCompareConstScore( unsigned * p, int nWords, int * pScores )
{
    int w, b;
    if ( p[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != ~0 )
                for ( b = 0; b < 32; b++ )
                    if ( ((~p[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != 0 )
                for ( b = 0; b < 32; b++ )
                    if ( ((p[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
}